

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

void test_adapter(void)

{
  element_type *peVar1;
  allocator local_81;
  string local_80 [32];
  shared_ptr<adapter::B2AAdapter> local_60;
  undefined1 local_50 [8];
  shared_ptr<adapter::ASocket> asocket;
  allocator local_29;
  string local_28 [32];
  
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_28,"adapter",&local_29);
  print_func_begin((string *)local_28);
  std::__cxx11::string::~string(local_28);
  std::allocator<char>::~allocator((allocator<char> *)&local_29);
  std::make_shared<adapter::ASocket>();
  peVar1 = std::__shared_ptr_access<adapter::ASocket,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<adapter::ASocket,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)local_50);
  (**peVar1->_vptr_ASocket)();
  std::make_shared<adapter::B2AAdapter>();
  std::shared_ptr<adapter::ASocket>::operator=((shared_ptr<adapter::ASocket> *)local_50,&local_60);
  std::shared_ptr<adapter::B2AAdapter>::~shared_ptr(&local_60);
  peVar1 = std::__shared_ptr_access<adapter::ASocket,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<adapter::ASocket,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)local_50);
  (**peVar1->_vptr_ASocket)();
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_80,"adapter",&local_81);
  print_func_end((string *)local_80);
  std::__cxx11::string::~string(local_80);
  std::allocator<char>::~allocator((allocator<char> *)&local_81);
  std::shared_ptr<adapter::ASocket>::~shared_ptr((shared_ptr<adapter::ASocket> *)local_50);
  return;
}

Assistant:

void test_adapter() {
    print_func_begin("adapter");
    std::shared_ptr<adapter::ASocket> asocket =
            std::make_shared<adapter::ASocket>();
    asocket->charge();

    asocket = std::make_shared<adapter::B2AAdapter>();
    asocket->charge();

    print_func_end("adapter");
}